

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O2

void Fxch_DivisorRemove(Fxch_Man_t *p,int Lit0,int Lit1,int Weight)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  if (Lit0 == Lit1) {
    __assert_fail("Lit0 != Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x174,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
  }
  iVar3 = Lit1;
  if (Lit0 < Lit1) {
    iVar3 = Lit0;
    Lit0 = Lit1;
  }
  piVar2 = Hash_Int2ManLookup(p->vHash,iVar3,Lit0);
  iVar3 = *piVar2;
  if ((0 < iVar3) && (iVar3 < (p->vWeights).nSize)) {
    Vec_FltAddToEntry(&p->vWeights,iVar3,(float)-Weight);
    iVar1 = Vec_QueIsMember(p->vPrio,iVar3);
    if (iVar1 == 0) {
      return;
    }
    Vec_QueUpdate(p->vPrio,iVar3);
    return;
  }
  __assert_fail("iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0x179,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
}

Assistant:

void Fxch_DivisorRemove( Fxch_Man_t * p, int Lit0, int Lit1, int Weight )
{
    int iDiv;
    assert( Lit0 != Lit1 );
    if ( Lit0 < Lit1 )
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit0, Lit1 );
    else
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit1, Lit0 );
    assert( iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights) );
    Vec_FltAddToEntry( &p->vWeights, iDiv, -Weight );
    if ( Vec_QueIsMember(p->vPrio, iDiv) )
        Vec_QueUpdate( p->vPrio, iDiv );
}